

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

int png_image_write_to_memory
              (png_imagep image,void *memory,png_alloc_size_t *memory_bytes,int convert_to_8bit,
              void *buffer,png_int_32 row_stride,void *colormap)

{
  int iVar1;
  char *error_message;
  png_imagep local_88;
  void *local_80;
  ulong local_78;
  void *pvStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  void *local_48;
  png_alloc_size_t local_40;
  ulong local_38;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    if (buffer != (void *)0x0 && memory_bytes != (png_alloc_size_t *)0x0) {
      if (memory == (void *)0x0) {
        *memory_bytes = 0;
      }
      iVar1 = png_image_write_init(image);
      if (iVar1 == 0) {
        return 0;
      }
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_78 = (ulong)(uint)row_stride;
      pvStack_70 = colormap;
      local_68 = (ulong)(uint)convert_to_8bit;
      local_40 = *memory_bytes;
      local_38 = 0;
      local_88 = image;
      local_80 = buffer;
      local_48 = memory;
      iVar1 = png_safe_execute(image,png_image_write_memory,&local_88);
      png_image_free(image);
      if (iVar1 != 0) {
        if ((memory != (void *)0x0) && (*memory_bytes < local_38)) {
          iVar1 = 0;
        }
        *memory_bytes = local_38;
        return iVar1;
      }
      return 0;
    }
    error_message = "png_image_write_to_memory: invalid argument";
  }
  else {
    error_message = "png_image_write_to_memory: incorrect PNG_IMAGE_VERSION";
  }
  iVar1 = png_image_error(image,error_message);
  return iVar1;
}

Assistant:

int PNGAPI
png_image_write_to_memory(png_imagep image, void *memory,
    png_alloc_size_t * PNG_RESTRICT memory_bytes, int convert_to_8bit,
    const void *buffer, png_int_32 row_stride, const void *colormap)
{
   /* Write the image to the given buffer, or count the bytes if it is NULL */
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (memory_bytes != NULL && buffer != NULL)
      {
         /* This is to give the caller an easier error detection in the NULL
          * case and guard against uninitialized variable problems:
          */
         if (memory == NULL)
            *memory_bytes = 0;

         if (png_image_write_init(image) != 0)
         {
            png_image_write_control display;
            int result;

            memset(&display, 0, (sizeof display));
            display.image = image;
            display.buffer = buffer;
            display.row_stride = row_stride;
            display.colormap = colormap;
            display.convert_to_8bit = convert_to_8bit;
            display.memory = png_voidcast(png_bytep, memory);
            display.memory_bytes = *memory_bytes;
            display.output_bytes = 0;

            result = png_safe_execute(image, png_image_write_memory, &display);
            png_image_free(image);

            /* write_memory returns true even if we ran out of buffer. */
            if (result)
            {
               /* On out-of-buffer this function returns '0' but still updates
                * memory_bytes:
                */
               if (memory != NULL && display.output_bytes > *memory_bytes)
                  result = 0;

               *memory_bytes = display.output_bytes;
            }

            return result;
         }

         else
            return 0;
      }

      else
         return png_image_error(image,
             "png_image_write_to_memory: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_write_to_memory: incorrect PNG_IMAGE_VERSION");

   else
      return 0;
}